

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_directory_descriptors(archive_write *a,vdd *vdd)

{
  int iVar1;
  uchar *__dest;
  uchar *wb;
  extr_rec *extr;
  int r;
  int depth;
  isoent *np;
  vdd *vdd_local;
  archive_write *a_local;
  
  extr._4_4_ = 0;
  _r = vdd->rootent;
  do {
    iVar1 = _write_directory_descriptors(a,vdd,_r,extr._4_4_);
    if (iVar1 < 0) {
      return iVar1;
    }
    if (vdd->vdd_type != VDD_JOLIET) {
      for (wb = (uchar *)(_r->extr_rec_list).first; wb != (uchar *)0x0; wb = *(uchar **)(wb + 0x808)
          ) {
        __dest = wb_buffptr(a);
        memcpy(__dest,wb + 8,(long)*(int *)(wb + 4));
        memset(__dest + *(int *)(wb + 4),0,(long)(0x800 - *(int *)(wb + 4)));
        iVar1 = wb_consume(a,0x800);
        if (iVar1 < 0) {
          return iVar1;
        }
      }
    }
    if (((_r->subdirs).first == (isoent *)0x0) || (vdd->max_depth <= extr._4_4_ + 1)) {
      for (; _r != _r->parent; _r = _r->parent) {
        if (_r->drnext != (isoent *)0x0) {
          _r = _r->drnext;
          break;
        }
        extr._4_4_ = extr._4_4_ + -1;
      }
    }
    else {
      _r = (_r->subdirs).first;
      extr._4_4_ = extr._4_4_ + 1;
    }
    if (_r == _r->parent) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
_write_directory_descriptors(struct archive_write *a, struct vdd *vdd,
    struct isoent *isoent, int depth)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isoent **enttbl;
	unsigned char *p, *wb;
	int i, r;
	int dr_l;

	p = wb = wb_buffptr(a);
#define WD_REMAINING	(LOGICAL_BLOCK_SIZE - (p - wb))
	p += set_directory_record(p, WD_REMAINING, isoent,
	    iso9660, DIR_REC_SELF, vdd->vdd_type);
	p += set_directory_record(p, WD_REMAINING, isoent,
	    iso9660, DIR_REC_PARENT, vdd->vdd_type);

	if (isoent->children.cnt <= 0 || (vdd->vdd_type != VDD_JOLIET &&
	    !iso9660->opt.rr && depth + 1 >= vdd->max_depth)) {
		memset(p, 0, WD_REMAINING);
		return (wb_consume(a, LOGICAL_BLOCK_SIZE));
	}

	enttbl = isoent->children_sorted;
	for (i = 0; i < isoent->children.cnt; i++) {
		struct isoent *np = enttbl[i];
		struct isofile *file = np->file;

		if (file->hardlink_target != NULL)
			file = file->hardlink_target;
		file->cur_content = &(file->content);
		do {
			dr_l = set_directory_record(p, WD_REMAINING,
			    np, iso9660, DIR_REC_NORMAL,
			    vdd->vdd_type);
			if (dr_l == 0) {
				memset(p, 0, WD_REMAINING);
				r = wb_consume(a, LOGICAL_BLOCK_SIZE);
				if (r < 0)
					return (r);
				p = wb = wb_buffptr(a);
				dr_l = set_directory_record(p,
				    WD_REMAINING, np, iso9660,
				    DIR_REC_NORMAL, vdd->vdd_type);
			}
			p += dr_l;
			file->cur_content = file->cur_content->next;
		} while (file->cur_content != NULL);
	}
	memset(p, 0, WD_REMAINING);
	return (wb_consume(a, LOGICAL_BLOCK_SIZE));
}